

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void singlesocket(Curl_multi *multi,SessionHandle *data)

{
  int *piVar1;
  connectdata *conn;
  uint uVar2;
  bool bVar3;
  curl_hash *h;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  undefined8 *p;
  void *pvVar8;
  long *plVar9;
  ulong uVar10;
  curl_llist_element *pcVar11;
  int in_EDX;
  uint uVar12;
  ulong uVar13;
  curl_socket_t s;
  curl_socket_t local_64;
  curl_hash *local_60;
  uint local_54;
  Curl_multi *local_50;
  curl_socket_t socks [5];
  
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    socks[lVar7] = -1;
  }
  uVar5 = multi_getsock(data,socks,in_EDX);
  local_60 = &multi->sockhash;
  lVar7 = 0;
  local_50 = multi;
  do {
    h = local_60;
    if (lVar7 == 5) {
      local_54 = 5;
LAB_0043f613:
      uVar13 = (ulong)local_54;
      lVar7 = 0;
      do {
        if (data->numsocks <= lVar7) {
          memcpy(data->sockets,socks,uVar13 << 2);
          data->numsocks = local_54;
          return;
        }
        s = data->sockets[lVar7];
        uVar10 = 0;
        do {
          if (uVar13 == uVar10) {
            if ((s == -1) || (plVar9 = (long *)Curl_hash_pick(local_60,&s,4), plVar9 == (long *)0x0)
               ) goto LAB_0043f733;
            conn = data->easy_conn;
            if (conn != (connectdata *)0x0) {
              bVar3 = true;
              if ((conn->recv_pipe != (curl_llist *)0x0) && (1 < conn->recv_pipe->size)) {
                if ((SessionHandle *)*plVar9 == data) {
                  _Var4 = Curl_recvpipe_head(data,conn);
                  pcVar11 = conn->recv_pipe->head;
                  if (_Var4) {
                    pcVar11 = pcVar11->next;
                  }
                  *plVar9 = (long)pcVar11->ptr;
                }
                bVar3 = false;
              }
              if ((conn->send_pipe != (curl_llist *)0x0) && (1 < conn->send_pipe->size)) {
                if ((SessionHandle *)*plVar9 == data) {
                  _Var4 = Curl_sendpipe_head(data,conn);
                  pcVar11 = conn->send_pipe->head;
                  if (_Var4) {
                    pvVar8 = pcVar11->next->ptr;
                  }
                  else {
                    pvVar8 = pcVar11->ptr;
                  }
                  *plVar9 = (long)pvVar8;
                }
                goto LAB_0043f733;
              }
              if (!bVar3) goto LAB_0043f733;
            }
            if (local_50->socket_cb != (curl_socket_callback)0x0) {
              (*local_50->socket_cb)(data,s,4,local_50->socket_userp,(void *)plVar9[2]);
            }
            sh_delentry(local_60,s);
            goto LAB_0043f733;
          }
          piVar1 = socks + uVar10;
          uVar10 = uVar10 + 1;
        } while (s != *piVar1);
        s = -1;
LAB_0043f733:
        lVar7 = lVar7 + 1;
      } while( true );
    }
    if ((uVar5 >> ((byte)lVar7 & 0x1f) & 0x10001) == 0) {
      local_54 = (uint)lVar7;
      goto LAB_0043f613;
    }
    s = socks[lVar7];
    p = (undefined8 *)Curl_hash_pick(local_60,&s,4);
    uVar12 = uVar5 >> ((byte)lVar7 & 0x1f);
    uVar6 = uVar12 & 1;
    uVar2 = uVar6 + 2;
    if ((uVar12 >> 0x10 & 1) == 0) {
      uVar2 = uVar6;
    }
    if (p == (undefined8 *)0x0) {
      local_64 = s;
      p = (undefined8 *)Curl_hash_pick(h,&local_64,4);
      if (p == (undefined8 *)0x0) {
        p = (undefined8 *)(*Curl_ccalloc)(1,0x18);
        if (p == (undefined8 *)0x0) {
          return;
        }
        *p = data;
        *(curl_socket_t *)((long)p + 0xc) = local_64;
        pvVar8 = Curl_hash_add(local_60,&local_64,4,p);
        if (pvVar8 == (void *)0x0) {
          (*Curl_cfree)(p);
          return;
        }
      }
LAB_0043f5d6:
      if (local_50->socket_cb != (curl_socket_callback)0x0) {
        (*local_50->socket_cb)(data,s,uVar2,local_50->socket_userp,(void *)p[2]);
      }
      *(uint *)(p + 1) = uVar2;
    }
    else if (*(uint *)(p + 1) != uVar2) goto LAB_0043f5d6;
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static void singlesocket(struct Curl_multi *multi,
                         struct SessionHandle *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  bool remove_sock_from_hash;

  for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks, MAX_SOCKSPEREASYHANDLE);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i=0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    int action = CURL_POLL_NONE;

    s = socks[i];

    /* get it from the hash */
    entry = Curl_hash_pick(&multi->sockhash, (char *)&s, sizeof(s));

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    if(entry) {
      /* yeps, already present so check if it has the same action set */
      if(entry->action == action)
        /* same, continue */
        continue;
    }
    else {
      /* this is a socket we didn't have before, add it! */
      entry = sh_addentry(&multi->sockhash, s, data);
      if(!entry)
        /* fatal */
        return;
    }

    /* we know (entry != NULL) at this point, see the logic above */
    if(multi->socket_cb)
      multi->socket_cb(data,
                       s,
                       action,
                       multi->socket_userp,
                       entry->socketp);

    entry->action = action; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i=0; i< data->numsocks; i++) {
    int j;
    s = data->sockets[i];
    for(j=0; j<num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        s = CURL_SOCKET_BAD;
        break;
      }
    }
    if(s != CURL_SOCKET_BAD) {

      /* this socket has been removed. Tell the app to remove it */
      remove_sock_from_hash = TRUE;

      entry = Curl_hash_pick(&multi->sockhash, (char *)&s, sizeof(s));
      if(entry) {
        /* check if the socket to be removed serves a connection which has
           other easy-s in a pipeline. In this case the socket should not be
           removed. */
        struct connectdata *easy_conn = data->easy_conn;
        if(easy_conn) {
          if(easy_conn->recv_pipe && easy_conn->recv_pipe->size > 1) {
            /* the handle should not be removed from the pipe yet */
            remove_sock_from_hash = FALSE;

            /* Update the sockhash entry to instead point to the next in line
               for the recv_pipe, or the first (in case this particular easy
               isn't already) */
            if(entry->easy == data) {
              if(Curl_recvpipe_head(data, easy_conn))
                entry->easy = easy_conn->recv_pipe->head->next->ptr;
              else
                entry->easy = easy_conn->recv_pipe->head->ptr;
            }
          }
          if(easy_conn->send_pipe  && easy_conn->send_pipe->size > 1) {
            /* the handle should not be removed from the pipe yet */
            remove_sock_from_hash = FALSE;

            /* Update the sockhash entry to instead point to the next in line
               for the send_pipe, or the first (in case this particular easy
               isn't already) */
            if(entry->easy == data) {
              if(Curl_sendpipe_head(data, easy_conn))
                entry->easy = easy_conn->send_pipe->head->next->ptr;
              else
                entry->easy = easy_conn->send_pipe->head->ptr;
            }
          }
          /* Don't worry about overwriting recv_pipe head with send_pipe_head,
             when action will be asked on the socket (see multi_socket()), the
             head of the correct pipe will be taken according to the
             action. */
        }
      }
      else
        /* just a precaution, this socket really SHOULD be in the hash already
           but in case it isn't, we don't have to tell the app to remove it
           either since it never got to know about it */
        remove_sock_from_hash = FALSE;

      if(remove_sock_from_hash) {
        /* in this case 'entry' is always non-NULL */
        if(multi->socket_cb)
          multi->socket_cb(data,
                           s,
                           CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(&multi->sockhash, s);
      }

    }
  }

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  data->numsocks = num;
}